

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warped_motion.c
# Opt level: O0

int16_t resolve_divisor_32(uint32_t D,int16_t *shift)

{
  int iVar1;
  short *in_RSI;
  uint in_EDI;
  int32_t e;
  int32_t f;
  int local_14;
  
  iVar1 = get_msb(in_EDI);
  *in_RSI = (short)iVar1;
  local_14 = in_EDI - (1 << ((byte)*in_RSI & 0x1f));
  if (*in_RSI < 9) {
    local_14 = local_14 << (8U - (char)*in_RSI & 0x1f);
  }
  else {
    local_14 = local_14 + ((1 << ((char)*in_RSI - 8U & 0x1f)) >> 1) >> ((char)*in_RSI - 8U & 0x1f);
  }
  *in_RSI = *in_RSI + 0xe;
  return div_lut[local_14];
}

Assistant:

static int16_t resolve_divisor_32(uint32_t D, int16_t *shift) {
  int32_t f;
  *shift = get_msb(D);
  // e is obtained from D after resetting the most significant 1 bit.
  const int32_t e = D - ((uint32_t)1 << *shift);
  // Get the most significant DIV_LUT_BITS (8) bits of e into f
  if (*shift > DIV_LUT_BITS)
    f = ROUND_POWER_OF_TWO(e, *shift - DIV_LUT_BITS);
  else
    f = e << (DIV_LUT_BITS - *shift);
  assert(f <= DIV_LUT_NUM);
  *shift += DIV_LUT_PREC_BITS;
  // Use f as lookup into the precomputed table of multipliers
  return div_lut[f];
}